

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
__thiscall
duckdb::CreateDuplicateEliminatedJoin
          (duckdb *this,vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns,
          JoinType join_type,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *original_plan,bool perform_delim)

{
  LogicalDependentJoin *this_00;
  pointer pLVar1;
  const_reference pvVar2;
  BoundColumnRefExpression *this_01;
  pointer *__ptr;
  size_type __n;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_58;
  vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_> *local_50;
  LogicalType local_48;
  
  local_50 = &correlated_columns->
              super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
  ;
  this_00 = (LogicalDependentJoin *)operator_new(0x1a8);
  LogicalDependentJoin::LogicalDependentJoin(this_00,join_type);
  *(LogicalDependentJoin **)this = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                         *)this);
  ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
  operator=(&(pLVar1->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ,local_50);
  pLVar1 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                         *)this);
  pLVar1->perform_delim = perform_delim;
  pLVar1 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                         *)this);
  (pLVar1->super_LogicalComparisonJoin).super_LogicalJoin.super_LogicalOperator.field_0x61 =
       join_type;
  pLVar1 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                         *)this);
  local_58._M_head_impl =
       (original_plan->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (original_plan->
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  LogicalOperator::AddChild
            ((LogicalOperator *)pLVar1,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_58);
  if (local_58._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_58._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_58._M_head_impl = (LogicalOperator *)0x0;
  if ((local_50->
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (local_50->
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar2 = vector<duckdb::CorrelatedColumnInfo,_true>::operator[]
                         ((vector<duckdb::CorrelatedColumnInfo,_true> *)local_50,__n);
      pLVar1 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
               ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                             *)this);
      this_01 = (BoundColumnRefExpression *)operator_new(0x70);
      LogicalType::LogicalType(&local_48,&pvVar2->type);
      BoundColumnRefExpression::BoundColumnRefExpression(this_01,&local_48,pvVar2->binding,0);
      LogicalType::~LogicalType(&local_48);
      local_60._M_head_impl = (Expression *)this_01;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&(pLVar1->super_LogicalComparisonJoin).duplicate_eliminated_columns,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_60);
      if ((BoundColumnRefExpression *)local_60._M_head_impl != (BoundColumnRefExpression *)0x0) {
        (*(((Expression *)&(local_60._M_head_impl)->super_BaseExpression)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      pLVar1 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
               ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                             *)this);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(pLVar1->super_LogicalComparisonJoin).mark_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &pvVar2->type);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(local_50->
                                  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_50->
                                  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 4) *
                          -0x3333333333333333));
  }
  return (unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>_>
          )(unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )this;
}

Assistant:

static unique_ptr<LogicalDependentJoin>
CreateDuplicateEliminatedJoin(const vector<CorrelatedColumnInfo> &correlated_columns, JoinType join_type,
                              unique_ptr<LogicalOperator> original_plan, bool perform_delim) {
	auto delim_join = make_uniq<LogicalDependentJoin>(join_type);
	delim_join->correlated_columns = correlated_columns;
	delim_join->perform_delim = perform_delim;
	delim_join->join_type = join_type;
	delim_join->AddChild(std::move(original_plan));
	for (idx_t i = 0; i < correlated_columns.size(); i++) {
		auto &col = correlated_columns[i];
		delim_join->duplicate_eliminated_columns.push_back(make_uniq<BoundColumnRefExpression>(col.type, col.binding));
		delim_join->mark_types.push_back(col.type);
	}
	return delim_join;
}